

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * kj::strTree<kj::String>(StringTree *__return_storage_ptr__,String *params)

{
  String *str;
  StringTree *pSVar1;
  StringTree local_50;
  String *local_18;
  String *params_local;
  
  local_18 = params;
  params_local = (String *)__return_storage_ptr__;
  str = fwd<kj::String>(params);
  _::toStringTreeOrCharSequence(&local_50,str);
  pSVar1 = StringTree::concat(&local_50);
  StringTree::StringTree(__return_storage_ptr__,pSVar1);
  StringTree::~StringTree(&local_50);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}